

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ClampWindowRect(ImGuiWindow_conflict *window,ImRect *visibility_rect)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 local_18;
  
  fVar1 = (window->Size).x;
  fVar2 = (window->Size).y;
  if (((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((window->Flags & 1) == 0)) {
    fVar2 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)window);
  }
  local_18.x = (visibility_rect->Min).x - fVar1;
  local_18.y = (visibility_rect->Min).y - fVar2;
  IVar3 = ImClamp(&window->Pos,&local_18,visibility_rect->Max);
  window->Pos = IVar3;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = window->Size;
    if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar))
        size_for_clamping.y = window->TitleBarHeight();
    window->Pos = ImClamp(window->Pos, visibility_rect.Min - size_for_clamping, visibility_rect.Max);
}